

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O0

void __thiscall Company::changeBoss(Company *this)

{
  int iVar1;
  Boss *this_00;
  double dVar2;
  double dVar3;
  int local_1c;
  int number;
  int i;
  Employee *maxEmp;
  Company *this_local;
  
  dVar2 = Employee::efficiency(&this->boss->super_Employee);
  if (dVar2 < 40.0) {
    this_00 = (Boss *)maxEfficiency(this);
    for (local_1c = 0; iVar1 = Boss::getNumberOfEmployees(this->boss), local_1c < iVar1;
        local_1c = local_1c + 1) {
      dVar2 = Employee::efficiency(this->employees[local_1c]);
      dVar3 = Employee::efficiency((Employee *)this_00);
      if ((dVar2 == dVar3) && (!NAN(dVar2) && !NAN(dVar3))) {
        iVar1 = Boss::getNumberOfEmployees(this->boss);
        this->employees[local_1c] = &this->boss->super_Employee;
        this->boss = this_00;
        Boss::setNumberOfEmployees(this->boss,iVar1);
        return;
      }
    }
  }
  return;
}

Assistant:

void Company::changeBoss() {
    if (boss->efficiency() < 40) {
        Employee *maxEmp = maxEfficiency();
        for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
            if (employees[i]->efficiency() ==  maxEmp->efficiency()) {
                int number = boss->getNumberOfEmployees();
                employees[i] = boss;
                boss = static_cast<Boss *>(maxEmp);
                boss->setNumberOfEmployees(number);
                break;
            }
        }
    }
}